

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBShadeRow_C(uint8_t *src_argb,uint8_t *dst_argb,int width,uint32_t value)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint32_t a;
  uint32_t r;
  uint32_t g;
  uint32_t b;
  int i;
  uint32_t a_scale;
  uint32_t r_scale;
  uint32_t g_scale;
  uint32_t b_scale;
  uint32_t value_local;
  int width_local;
  uint8_t *dst_argb_local;
  uint8_t *src_argb_local;
  
  dst_argb_local = dst_argb;
  src_argb_local = src_argb;
  for (i = 0; i < width; i = i + 1) {
    uVar1 = src_argb_local[1];
    uVar2 = src_argb_local[1];
    uVar3 = src_argb_local[2];
    uVar4 = src_argb_local[2];
    uVar5 = src_argb_local[3];
    uVar6 = src_argb_local[3];
    *dst_argb_local =
         (uint8_t)((value & 0xff | (value & 0xff) << 8) *
                   (uint)CONCAT11(*src_argb_local,*src_argb_local) >> 0x18);
    dst_argb_local[1] =
         (uint8_t)((value >> 8 & 0xff | (value >> 8 & 0xff) << 8) * (uint)CONCAT11(uVar2,uVar1) >>
                  0x18);
    dst_argb_local[2] =
         (uint8_t)((value >> 0x10 & 0xff | (value >> 0x10 & 0xff) << 8) *
                   (uint)CONCAT11(uVar4,uVar3) >> 0x18);
    dst_argb_local[3] =
         (uint8_t)((value >> 0x18 | (value >> 0x18) << 8) * (uint)CONCAT11(uVar6,uVar5) >> 0x18);
    src_argb_local = src_argb_local + 4;
    dst_argb_local = dst_argb_local + 4;
  }
  return;
}

Assistant:

void ARGBShadeRow_C(const uint8_t* src_argb,
                    uint8_t* dst_argb,
                    int width,
                    uint32_t value) {
  const uint32_t b_scale = REPEAT8(value & 0xff);
  const uint32_t g_scale = REPEAT8((value >> 8) & 0xff);
  const uint32_t r_scale = REPEAT8((value >> 16) & 0xff);
  const uint32_t a_scale = REPEAT8(value >> 24);

  int i;
  for (i = 0; i < width; ++i) {
    const uint32_t b = REPEAT8(src_argb[0]);
    const uint32_t g = REPEAT8(src_argb[1]);
    const uint32_t r = REPEAT8(src_argb[2]);
    const uint32_t a = REPEAT8(src_argb[3]);
    dst_argb[0] = SHADE(b, b_scale);
    dst_argb[1] = SHADE(g, g_scale);
    dst_argb[2] = SHADE(r, r_scale);
    dst_argb[3] = SHADE(a, a_scale);
    src_argb += 4;
    dst_argb += 4;
  }
}